

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O0

uint64_t __thiscall
slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
operator()(hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  uint64_t uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  size_t in_stack_00000068;
  void *in_stack_00000070;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f4408);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RSI);
  uVar1 = detail::hashing::hash(in_stack_00000070,in_stack_00000068);
  return uVar1;
}

Assistant:

uint64_t operator()(const std::basic_string<CharT>& str) const noexcept {
        return detail::hashing::hash(str.data(), sizeof(CharT) * str.size());
    }